

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtObj.c
# Opt level: O3

newtRef NewtMakeSlotsObj(newtRefArg r,uint32_t n,uint16_t type)

{
  undefined1 auVar1 [16];
  newtObjRef pnVar2;
  undefined1 *puVar3;
  newtObjRef pnVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  long lVar8;
  
  pnVar2 = NewtObjAlloc(r,n * 8,type | 1,false);
  auVar1 = _DAT_0011d910;
  if (pnVar2 == (newtObjRef)0x0) {
    puVar3 = (undefined1 *)0x2;
  }
  else {
    pnVar4 = pnVar2 + 1;
    if (((pnVar2->header).flags & 0x40) == 0) {
      pnVar4 = *(newtObjRef *)&pnVar4->header;
    }
    if (n != 0) {
      lVar8 = (ulong)n - 1;
      auVar6._8_4_ = (int)lVar8;
      auVar6._0_8_ = lVar8;
      auVar6._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar5 = 0;
      auVar6 = auVar6 ^ _DAT_0011d910;
      auVar7 = _DAT_0011d900;
      do {
        auVar9 = auVar7 ^ auVar1;
        if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                    auVar6._4_4_ < auVar9._4_4_) & 1)) {
          *(undefined8 *)((long)&(pnVar4->header).size + uVar5) = 0xfff2;
        }
        if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
            auVar9._12_4_ <= auVar6._12_4_) {
          *(undefined8 *)((long)&(pnVar4->header).nextp + uVar5) = 0xfff2;
        }
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar8 + 2;
        uVar5 = uVar5 + 0x10;
      } while (((ulong)n * 8 + 8 & 0xfffffffffffffff0) != uVar5);
    }
    puVar3 = (undefined1 *)((long)&(pnVar2->header).size + 1);
  }
  return (newtRef)puVar3;
}

Assistant:

newtRef NewtMakeSlotsObj(newtRefArg r, uint32_t n, uint16_t type)
{
    newtObjRef	obj;
    uint32_t	size;
    
    size = sizeof(newtRef) * n;
    obj = NewtObjAlloc(r, size, kNewtObjSlotted | type, false);
    
    if (obj != NULL)
    {
        newtRef *	slots;
        uint32_t	i;
        
        slots = NewtObjToSlots(obj);
        
        for (i = 0; i < n; i++)
        {
            slots[i] = kNewtRefUnbind;
        }
        
        return NewtMakePointer(obj);
    }
    
    return kNewtRefNIL;
}